

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_data.cpp
# Opt level: O1

void duckdb::ArrowUnionData::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
  *this;
  append_vector_t p_Var1;
  byte bVar2;
  uchar uVar3;
  Value *other;
  reference pvVar4;
  reference this_00;
  pointer pAVar5;
  type pAVar6;
  LogicalType *type;
  idx_t index;
  unsigned_long val;
  size_type __n;
  size_type __n_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child;
  element_type *peVar7;
  vector<duckdb::Vector,_true> child_vectors;
  idx_t size;
  Value resolved_value;
  UnifiedVectorFormat format;
  vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> local_188;
  idx_t local_168;
  idx_t local_160;
  idx_t local_158;
  ArrowAppendData *local_150;
  Vector *local_148;
  reference local_140;
  Value local_138;
  Value local_f8;
  UnifiedVectorFormat local_b8;
  Value local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  local_148 = input;
  Vector::ToUnifiedFormat(input,input_size,&local_b8);
  local_158 = to - from;
  local_140 = vector<duckdb::ArrowBuffer,_true>::operator[](&append_data->arrow_buffers,1);
  local_188.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = from;
  local_160 = to;
  local_150 = append_data;
  UnionType::CopyMemberTypes_abi_cxx11_
            ((child_list_t<LogicalType> *)&local_138,(UnionType *)&local_148->type,type);
  if ((element_type *)local_138.type_._0_8_ !=
      local_138.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    peVar7 = (element_type *)local_138.type_._0_8_;
    do {
      ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
      emplace_back<duckdb::LogicalType_const&,unsigned_long&>
                ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&local_188,
                 (LogicalType *)
                 ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&peVar7->alias)->_M_local_buf + 0x10),&local_158);
      peVar7 = peVar7 + 1;
    } while (peVar7 != local_138.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_138);
  if (local_168 < local_160) {
    index = local_168;
    do {
      Vector::GetValue(&local_138,local_148,index);
      Value::Value(&local_f8,(nullptr_t)0x0);
      if (local_138.is_null == false) {
        bVar2 = UnionValue::GetTag(&local_138);
        other = UnionValue::GetValue(&local_138);
        Value::operator=(&local_f8,other);
        val = (unsigned_long)bVar2;
      }
      else {
        val = 0;
      }
      if (local_188.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_188.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&local_188,__n);
          if (val == __n) {
            Value::Value(&local_70,&local_f8);
          }
          else {
            Value::Value(&local_70,(nullptr_t)0x0);
          }
          Vector::SetValue(pvVar4,index,&local_70);
          Value::~Value(&local_70);
          __n = __n + 1;
        } while (__n < (ulong)(((long)local_188.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_188.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x4ec4ec4ec4ec4ec5));
      }
      uVar3 = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val);
      ArrowBuffer::reserve(local_140,local_140->count + 1);
      local_140->dataptr[local_140->count] = uVar3;
      local_140->count = local_140->count + 1;
      Value::~Value(&local_f8);
      Value::~Value(&local_138);
      index = index + 1;
    } while (index != local_160);
  }
  if (local_188.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_188.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this = &local_150->child_data;
    __n_00 = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
                ::operator[](this,__n_00);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&local_188,__n_00);
      pAVar5 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
               ::operator->(this_00);
      p_Var1 = pAVar5->append_vector;
      pAVar6 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
               ::operator*(this_00);
      (*p_Var1)(pAVar6,pvVar4,local_168,local_160,local_158);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)local_188.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_188.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  local_150->row_count = local_150->row_count + local_158;
  ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::~vector(&local_188);
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ArrowUnionData::Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
	UnifiedVectorFormat format;
	input.ToUnifiedFormat(input_size, format);
	idx_t size = to - from;

	auto &types_buffer = append_data.GetMainBuffer();

	duckdb::vector<Vector> child_vectors;
	for (const auto &child : UnionType::CopyMemberTypes(input.GetType())) {
		child_vectors.emplace_back(child.second, size);
	}

	for (idx_t input_idx = from; input_idx < to; input_idx++) {
		const auto &val = input.GetValue(input_idx);

		idx_t tag = 0;
		Value resolved_value(nullptr);
		if (!val.IsNull()) {
			tag = UnionValue::GetTag(val);

			resolved_value = UnionValue::GetValue(val);
		}

		for (idx_t child_idx = 0; child_idx < child_vectors.size(); child_idx++) {
			child_vectors[child_idx].SetValue(input_idx, child_idx == tag ? resolved_value : Value(nullptr));
		}
		types_buffer.push_back<data_t>(NumericCast<data_t>(tag));
	}

	for (idx_t child_idx = 0; child_idx < child_vectors.size(); child_idx++) {
		auto &child_buffer = append_data.child_data[child_idx];
		auto &child = child_vectors[child_idx];
		child_buffer->append_vector(*child_buffer, child, from, to, size);
	}
	append_data.row_count += size;
}